

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

void Js::JavascriptRegExp::SetLastIndexProperty
               (Var instance,CharCount lastIndex,ScriptContext *scriptContext)

{
  Var lastIndex_00;
  ScriptContext *scriptContext_local;
  CharCount lastIndex_local;
  Var instance_local;
  
  lastIndex_00 = JavascriptNumber::ToVar(lastIndex,scriptContext);
  SetLastIndexProperty(instance,lastIndex_00,scriptContext);
  return;
}

Assistant:

void JavascriptRegExp::SetLastIndexProperty(Var instance, CharCount lastIndex, ScriptContext* scriptContext)
    {
        SetLastIndexProperty(
            instance,
            JavascriptNumber::ToVar(lastIndex, scriptContext),
            scriptContext);
    }